

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::getShaderSamplerOrImageType_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,ChannelType formatType,
          TextureType textureType,bool isSampler)

{
  bool *__rhs;
  char *__rhs_00;
  char *__rhs_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((uint)this < 0x22) && ((0x2c0000000U >> ((ulong)this & 0x3f) & 1) != 0)) {
    __rhs = (bool *)0x172e154;
  }
  else {
    __rhs = glcts::fixed_sample_locations_values + 1;
    if ((uint)this - 0x1b < 3) {
      __rhs = (bool *)0x1899da1;
    }
  }
  if ((formatType < UNORM_SHORT_565) && ((0x8bU >> (formatType & UNSIGNED_INT16) & 1) != 0)) {
    __rhs_01 = &DAT_018a5f2c + *(int *)(&DAT_018a5f2c + (ulong)formatType * 4);
  }
  else {
    __rhs_01 = (char *)0x0;
    if (formatType == SNORM_INT32) {
      __rhs_01 = "2DArray";
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_58,&local_78,__rhs);
  __rhs_00 = "image";
  if ((char)textureType != '\0') {
    __rhs_00 = "sampler";
  }
  std::operator+(&local_38,&local_58,__rhs_00);
  std::operator+(__return_storage_ptr__,&local_38,__rhs_01);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderSamplerOrImageType (TextureFormat::ChannelType formatType, TextureType textureType, bool isSampler)
{
	const char* const formatPart		= isFormatTypeUnsignedInteger(formatType)	? "u"
										: isFormatTypeSignedInteger(formatType)		? "i"
										: "";

	const char* const imageTypePart		= textureType == TEXTURETYPE_BUFFER		? "Buffer"
										: textureType == TEXTURETYPE_2D			? "2D"
										: textureType == TEXTURETYPE_3D			? "3D"
										: textureType == TEXTURETYPE_CUBE		? "Cube"
										: textureType == TEXTURETYPE_2D_ARRAY	? "2DArray"
										: DE_NULL;

	return string() + formatPart + (isSampler ? "sampler" : "image") + imageTypePart;
}